

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

Ast __thiscall
lambda::anon_unknown_1::reduce_rec(anon_unknown_1 *this,Parse_ast *ast,Context *context)

{
  type tVar1;
  Ast AVar2;
  anon_class_8_1_bc11688f local_38;
  anon_class_8_1_bc11688f local_30;
  anon_class_8_1_bc11688f local_28;
  Context *local_20;
  Context *context_local;
  Parse_ast *ast_local;
  
  local_20 = context;
  context_local = (Context *)ast;
  ast_local = (Parse_ast *)this;
  ublib::match<lambda::Parse_ast_const&>((ublib *)&local_28,ast);
  local_30.context = local_20;
  local_38.context = local_20;
  tVar1 = ublib::impl::Matcher<lambda::Parse_ast_const&>::operator()
                    ((Matcher<lambda::Parse_ast_const&> *)this,&local_28,&local_30,&local_38);
  AVar2.underlying_.
  super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       tVar1.underlying_.
       super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  AVar2.underlying_.
  super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ast)AVar2.underlying_.
              super___shared_ptr<const_std::variant<lambda::Ast::Variable,_lambda::Ast::Free_variable,_lambda::Ast::Call,_lambda::Ast::Lambda>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ast reduce_rec(Parse_ast const& ast, Context& context) {
    return ublib::match(ast)(
        [&](Parse_ast::Variable const& e) {
          if (auto idx = find_in_context(context, e.name())) {
            return Ast(Ast::Variable(*idx));
          } else {
            return Ast(Ast::Free_variable(e.name()));
          }
        },
        [&](Parse_ast::Call const& e) {
          auto arg = reduce_rec(e.argument(), context);
          auto callee = reduce_rec(e.callee(), context);
          return Ast(Ast::Call(std::move(callee), std::move(arg)));
        },
        [&](Parse_ast::Lambda const& e) {
          context.push_back(e.parameter());
          auto typed = reduce_rec(e.expression(), context);
          context.pop_back();
          return Ast(Ast::Lambda(e.parameter(), std::move(typed)));
        });
  }